

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * dmrC_evaluate_statement(dmr_C *C,statement *stmt)

{
  char cVar1;
  ident *piVar2;
  statement_list *psVar3;
  long lVar4;
  expression *peVar5;
  symbol *psVar6;
  char *pcVar7;
  symbol *psVar8;
  statement *stmt_00;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  expression **enumcase;
  symbol *unaff_R13;
  expression *local_60;
  ptr_list_iter local_58;
  ulong local_40;
  symbol *local_38;
  
  psVar6 = (symbol *)0x0;
  uVar11 = 0;
  while (psVar8 = psVar6, stmt != (statement *)0x0) {
    if (stmt->type == STMT_LABEL) {
      stmt = (stmt->field_2).field_3.if_true;
    }
    else {
      uVar10 = uVar11;
      local_40 = uVar11;
      switch(stmt->type) {
      case STMT_DECLARATION:
        ptrlist_forward_iterator(&local_58,(ptr_list *)(stmt->field_2).field_1.expression);
        while (psVar6 = (symbol *)ptrlist_iter_next(&local_58), psVar6 != (symbol *)0x0) {
          evaluate_symbol(C,psVar6);
        }
LAB_0010e20c:
        psVar8 = (symbol *)0x0;
        goto switchD_0010dc8a_caseD_9;
      case STMT_EXPRESSION:
        psVar6 = dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
        if (psVar6 == (symbol *)0x0) goto LAB_0010e20c;
        peVar5 = (stmt->field_2).field_1.expression;
        if (peVar5->ctype == &C->S->null_ctype) {
          peVar5 = cast_to(C,peVar5,&C->S->ptr_ctype);
          (stmt->field_2).field_1.expression = peVar5;
        }
        psVar8 = degenerate(C,(stmt->field_2).field_1.expression);
        goto switchD_0010dc8a_caseD_9;
      case STMT_COMPOUND:
        evaluate_symbol(C,(stmt->field_2).field_2.ret_target);
        psVar8 = dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
        ptrlist_forward_iterator(&local_58,(ptr_list *)(stmt->field_2).field_1.expression);
        while (stmt_00 = (statement *)ptrlist_iter_next(&local_58), stmt_00 != (statement *)0x0) {
          psVar8 = dmrC_evaluate_statement(C,stmt_00);
        }
        if (psVar8 == (symbol *)0x0) {
          psVar8 = &C->S->void_ctype;
        }
        goto switchD_0010dc8a_caseD_9;
      case STMT_IF:
        peVar5 = (stmt->field_2).field_1.expression;
        psVar8 = (symbol *)0x0;
        if (peVar5 == (expression *)0x0) goto switchD_0010dc8a_caseD_9;
        local_38 = unaff_R13;
        evaluate_conditional(C,peVar5,0);
        dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
        break;
      case STMT_RETURN:
        peVar5 = (stmt->field_2).field_1.expression;
        dmrC_evaluate_expression(C,peVar5);
        psVar6 = (C->current_fn->field_14).field_2.ctype.base_type;
        if ((psVar6 == (symbol *)0x0) || (psVar6 == &C->S->void_ctype)) {
          if (peVar5 == (expression *)0x0) goto LAB_0010e20c;
          if (peVar5->ctype != &C->S->void_ctype) {
            pcVar7 = "void";
            if (psVar6 == (symbol *)0x0) {
              pcVar7 = "typeless";
            }
            dmrC_expression_error(C,peVar5,"return expression in %s function",pcVar7);
          }
          if (C->Wreturn_void == 0) goto LAB_0010e20c;
          psVar8 = (symbol *)0x0;
          dmrC_warning(C,stmt->pos,"returning void-valued expression");
        }
        else {
          if (peVar5 != (expression *)0x0) {
            if (peVar5->ctype != (symbol *)0x0) {
              compatible_assignment_types
                        (C,peVar5,psVar6,(expression **)&(stmt->field_2).field_0,"return expression"
                        );
            }
            goto LAB_0010e20c;
          }
          psVar8 = (symbol *)0x0;
          dmrC_sparse_error(C,stmt->pos,"return with no return value");
        }
        goto switchD_0010dc8a_caseD_9;
      case STMT_CASE:
        local_38 = unaff_R13;
        dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
        dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
        break;
      case STMT_SWITCH:
        local_60 = (expression *)0x0;
        peVar5 = (stmt->field_2).field_1.expression;
        dmrC_evaluate_expression(C,peVar5);
        dmrC_evaluate_statement(C,(stmt->field_2).field_3.if_true);
        if (peVar5 != (expression *)0x0) {
          psVar6 = peVar5->ctype;
          if (psVar6 == (symbol *)0x0) {
            enumcase = &local_60;
          }
          else {
            if (*(char *)psVar6 == '\x03') {
              psVar6 = *(symbol **)((long)&psVar6->field_14 + 0x38);
            }
            enumcase = &local_60;
            if (*(char *)psVar6 == '\t') {
              enumcase = (expression **)0x0;
            }
          }
          local_38 = unaff_R13;
          ptrlist_forward_iterator
                    (&local_58,(ptr_list *)((stmt->field_2).field_10.asm_clobbers)->list_[0xf]);
          while (pvVar9 = ptrlist_iter_next(&local_58), unaff_R13 = local_38, pvVar9 != (void *)0x0)
          {
            lVar4 = *(long *)((long)pvVar9 + 0x90);
            check_case_type(C,peVar5,*(expression **)(lVar4 + 0x10),enumcase);
            check_case_type(C,peVar5,*(expression **)(lVar4 + 0x18),enumcase);
          }
        }
        goto LAB_0010e2f3;
      case STMT_ITERATOR:
        local_38 = unaff_R13;
        dmrC_evaluate_symbol_list(C,(stmt->field_2).field_8.iterator_syms);
        evaluate_conditional(C,(stmt->field_2).field_8.iterator_pre_condition,1);
        evaluate_conditional(C,(stmt->field_2).field_8.iterator_post_condition,1);
        dmrC_evaluate_statement(C,(stmt->field_2).field_4.args);
        dmrC_evaluate_statement(C,(stmt->field_2).field_8.iterator_statement);
        stmt = (stmt->field_2).field_8.iterator_post_statement;
        goto LAB_0010dd2e;
      default:
        goto switchD_0010dc8a_caseD_9;
      case STMT_GOTO:
        psVar3 = (stmt->field_2).field_4.stmts;
        if (((psVar3 != (statement_list *)0x0) && (psVar3->list_[0xe] == (statement *)0x0)) &&
           (((psVar3->allocator_->size_ & 0x400) == 0 ||
            (psVar6 = dmrC_lookup_symbol((ident *)psVar3->allocator_,NS_KEYWORD),
            psVar6 == (symbol *)0x0)))) {
          pcVar7 = dmrC_show_ident(C,(ident *)psVar3->allocator_);
          dmrC_sparse_error(C,stmt->pos,"label \'%s\' was not declared",pcVar7);
        }
        dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
        goto LAB_0010e20c;
      case STMT_ASM:
        peVar5 = (stmt->field_2).field_1.expression;
        if ((peVar5 == (expression *)0x0) || (*(char *)peVar5 != '\x02')) {
          dmrC_sparse_error(C,stmt->pos,"need constant string for inline asm");
          goto LAB_0010e2f3;
        }
        local_38 = unaff_R13;
        ptrlist_forward_iterator(&local_58,(ptr_list *)(stmt->field_2).field_1.context);
        peVar5 = (expression *)ptrlist_iter_next(&local_58);
        if (peVar5 == (expression *)0x0) goto LAB_0010de74;
        iVar12 = 0;
        goto LAB_0010dd9d;
      case STMT_CONTEXT:
        dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
        goto LAB_0010e1a5;
      case STMT_RANGE:
        dmrC_evaluate_expression(C,(stmt->field_2).field_1.expression);
        dmrC_evaluate_expression(C,(stmt->field_2).field_1.context);
        dmrC_evaluate_expression(C,(stmt->field_2).field_11.range_high);
LAB_0010e1a5:
        psVar8 = (symbol *)0x0;
        goto switchD_0010dc8a_caseD_9;
      }
      stmt = (stmt->field_2).field_3.if_false;
LAB_0010dd2e:
      unaff_R13 = local_38;
      if ((uVar11 & 1) == 0) {
        unaff_R13 = psVar6;
      }
      uVar11 = CONCAT71((int7)(uVar10 >> 8),1);
    }
  }
  goto switchD_0010dc8a_caseD_9;
LAB_0010dd9d:
  do {
    if (iVar12 == 0) {
      iVar12 = 1;
    }
    else if (iVar12 == 2) {
      psVar6 = dmrC_evaluate_expression(C,peVar5);
      unaff_R13 = local_38;
      if (psVar6 == (symbol *)0x0) goto LAB_0010e2f3;
      if ((*(char *)peVar5 != '\t') || (peVar5->op != 0x2a)) {
        dmrC_warning(C,peVar5->pos,"asm output is not an lvalue");
      }
      evaluate_assign_to(C,peVar5,peVar5->ctype);
      iVar12 = 0;
    }
    else if (*(char *)peVar5 == '\x02') {
      piVar2 = (peVar5->field_5).field_4.symbol_name;
      cVar1 = *(char *)((long)&piVar2->next + 4);
      iVar12 = 2;
      if ((cVar1 != '+') && (cVar1 != '=')) {
        dmrC_expression_error
                  (C,peVar5,"output constraint is not an assignment constraint (\"%s\")",
                   (undefined1 *)((long)&piVar2->next + 4));
      }
    }
    else {
      dmrC_sparse_error(C,peVar5->pos,"asm output constraint is not a string");
      (local_58.__list)->list_[local_58.__nr] = (void *)0x0;
      iVar12 = 2;
    }
    peVar5 = (expression *)ptrlist_iter_next(&local_58);
  } while (peVar5 != (expression *)0x0);
LAB_0010de74:
  ptrlist_forward_iterator(&local_58,(ptr_list *)(stmt->field_2).field_3.if_false);
  peVar5 = (expression *)ptrlist_iter_next(&local_58);
  if (peVar5 != (expression *)0x0) {
    iVar12 = 0;
    do {
      if (iVar12 == 0) {
        iVar12 = 1;
      }
      else if (iVar12 == 2) {
        psVar6 = dmrC_evaluate_expression(C,peVar5);
        iVar12 = 0;
        unaff_R13 = local_38;
        if (psVar6 == (symbol *)0x0) goto LAB_0010e2f3;
      }
      else if (*(char *)peVar5 == '\x02') {
        piVar2 = (peVar5->field_5).field_4.symbol_name;
        cVar1 = *(char *)((long)&piVar2->next + 4);
        iVar12 = 2;
        if ((cVar1 == '=') || (cVar1 == '+')) {
          dmrC_expression_error
                    (C,peVar5,"input constraint with assignment (\"%s\")",
                     (undefined1 *)((long)&piVar2->next + 4));
        }
      }
      else {
        dmrC_sparse_error(C,peVar5->pos,"asm input constraint is not a string");
        (local_58.__list)->list_[local_58.__nr] = (void *)0x0;
        iVar12 = 2;
      }
      peVar5 = (expression *)ptrlist_iter_next(&local_58);
    } while (peVar5 != (expression *)0x0);
  }
  ptrlist_forward_iterator(&local_58,(ptr_list *)(stmt->field_2).field_4.args);
  peVar5 = (expression *)ptrlist_iter_next(&local_58);
  unaff_R13 = local_38;
  while (peVar5 != (expression *)0x0) {
    if (*(char *)peVar5 != '\x02') {
      dmrC_expression_error(C,peVar5,"asm clobber is not a string");
    }
    peVar5 = (expression *)ptrlist_iter_next(&local_58);
  }
  ptrlist_forward_iterator(&local_58,(ptr_list *)(stmt->field_2).field_8.iterator_pre_condition);
  do {
    pcVar7 = (char *)ptrlist_iter_next(&local_58);
    if (pcVar7 == (char *)0x0) goto LAB_0010e2f3;
  } while (*pcVar7 == '\x0e');
  dmrC_sparse_error(C,stmt->pos,"bad asm label");
LAB_0010e2f3:
  uVar11 = local_40;
  psVar8 = (symbol *)0x0;
switchD_0010dc8a_caseD_9:
  if ((uVar11 & 1) != 0) {
    psVar8 = unaff_R13;
  }
  return psVar8;
}

Assistant:

struct symbol *dmrC_evaluate_statement(struct dmr_C *C, struct statement *stmt)
{
	if (!stmt)
		return NULL;

	switch (stmt->type) {
	case STMT_DECLARATION: {
		struct symbol *s;
		FOR_EACH_PTR(stmt->declaration, s) {
			evaluate_symbol(C, s);
		} END_FOR_EACH_PTR(s);
		return NULL;
	}

	case STMT_RETURN:
		return evaluate_return_expression(C, stmt);

	case STMT_EXPRESSION:
		if (!dmrC_evaluate_expression(C, stmt->expression))
			return NULL;
		if (stmt->expression->ctype == &C->S->null_ctype)
			stmt->expression = cast_to(C, stmt->expression, &C->S->ptr_ctype);
		return degenerate(C, stmt->expression);

	case STMT_COMPOUND: {
		struct statement *s;
		struct symbol *type = NULL;

		/* Evaluate the return symbol in the compound statement */
		evaluate_symbol(C, stmt->ret);

		/*
		 * Then, evaluate each statement, making the type of the
		 * compound statement be the type of the last statement
		 */
		type = dmrC_evaluate_statement(C, stmt->args);
		FOR_EACH_PTR(stmt->stmts, s) {
			type = dmrC_evaluate_statement(C, s);
		} END_FOR_EACH_PTR(s);
		if (!type)
			type = &C->S->void_ctype;
		return type;
	}
	case STMT_IF:
		evaluate_if_statement(C, stmt);
		return NULL;
	case STMT_ITERATOR:
		evaluate_iterator(C, stmt);
		return NULL;
	case STMT_SWITCH:
		evaluate_switch_statement(C, stmt);
		return NULL;
	case STMT_CASE:
		evaluate_case_statement(C, stmt);
		return NULL;
	case STMT_LABEL:
		return dmrC_evaluate_statement(C, stmt->label_statement);
	case STMT_GOTO:
		evaluate_goto_statement(C, stmt);
		return NULL;
	case STMT_NONE:
		break;
	case STMT_ASM:
		evaluate_asm_statement(C, stmt);
		return NULL;
	case STMT_CONTEXT:
		dmrC_evaluate_expression(C, stmt->expression);
		return NULL;
	case STMT_RANGE:
		dmrC_evaluate_expression(C, stmt->range_expression);
		dmrC_evaluate_expression(C, stmt->range_low);
		dmrC_evaluate_expression(C, stmt->range_high);
		return NULL;
	}
	return NULL;
}